

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

void MapOptHandler_PrecacheSounds(FMapInfoParser *parse,level_info_t *info)

{
  bool bVar1;
  int iVar2;
  FSoundID local_1c;
  level_info_t *plStack_18;
  FSoundID snd;
  level_info_t *info_local;
  FMapInfoParser *parse_local;
  
  plStack_18 = info;
  FMapInfoParser::ParseAssign(parse);
  do {
    FScanner::MustGetString(&parse->sc);
    FSoundID::FSoundID(&local_1c,(parse->sc).String);
    iVar2 = FSoundID::operator_cast_to_int(&local_1c);
    if (iVar2 == 0) {
      FScanner::ScriptMessage(&parse->sc,"Unknown sound \"%s\"",(parse->sc).String);
    }
    else {
      TArray<FSoundID,_FSoundID>::Push(&plStack_18->PrecacheSounds,&local_1c);
    }
    bVar1 = FScanner::CheckString(&parse->sc,",");
  } while (bVar1);
  return;
}

Assistant:

DEFINE_MAP_OPTION(PrecacheSounds, true)
{
	parse.ParseAssign();

	do
	{
		parse.sc.MustGetString();
		FSoundID snd = parse.sc.String;
		if (snd == 0)
		{
			parse.sc.ScriptMessage("Unknown sound \"%s\"", parse.sc.String);
		}
		else
		{
			info->PrecacheSounds.Push(snd);
		}
	} while (parse.sc.CheckString(","));
}